

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O0

void __thiscall Fl_Scroll::bbox(Fl_Scroll *this,int *X,int *Y,int *W,int *H)

{
  int iVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  uint uVar4;
  Fl_Align FVar5;
  int *H_local;
  int *W_local;
  int *Y_local;
  int *X_local;
  Fl_Scroll *this_local;
  
  iVar1 = Fl_Widget::x((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dx(FVar2);
  *X = iVar1 + iVar3;
  iVar1 = Fl_Widget::y((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dy(FVar2);
  *Y = iVar1 + iVar3;
  iVar1 = Fl_Widget::w((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dw(FVar2);
  *W = iVar1 - iVar3;
  iVar1 = Fl_Widget::h((Fl_Widget *)this);
  FVar2 = Fl_Widget::box((Fl_Widget *)this);
  iVar3 = Fl::box_dh(FVar2);
  *H = iVar1 - iVar3;
  uVar4 = Fl_Widget::visible((Fl_Widget *)&this->scrollbar);
  if (uVar4 != 0) {
    iVar1 = Fl_Widget::w((Fl_Widget *)&this->scrollbar);
    *W = *W - iVar1;
    FVar5 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar5 & 4) != 0) {
      iVar1 = Fl_Widget::w((Fl_Widget *)&this->scrollbar);
      *X = iVar1 + *X;
    }
  }
  uVar4 = Fl_Widget::visible((Fl_Widget *)&this->hscrollbar);
  if (uVar4 != 0) {
    iVar1 = Fl_Widget::h((Fl_Widget *)&this->hscrollbar);
    *H = *H - iVar1;
    FVar5 = Fl_Widget::align((Fl_Widget *)&this->scrollbar);
    if ((FVar5 & 1) != 0) {
      iVar1 = Fl_Widget::h((Fl_Widget *)&this->hscrollbar);
      *Y = iVar1 + *Y;
    }
  }
  return;
}

Assistant:

void Fl_Scroll::bbox(int& X, int& Y, int& W, int& H) {
  X = x()+Fl::box_dx(box());
  Y = y()+Fl::box_dy(box());
  W = w()-Fl::box_dw(box());
  H = h()-Fl::box_dh(box());
  if (scrollbar.visible()) {
    W -= scrollbar.w();
    if (scrollbar.align() & FL_ALIGN_LEFT) X += scrollbar.w();
  }
  if (hscrollbar.visible()) {
    H -= hscrollbar.h();
    if (scrollbar.align() & FL_ALIGN_TOP) Y += hscrollbar.h();
  }
}